

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::UpdateTxOutAmount
          (RawTransactionResponseStruct *__return_storage_ptr__,
          UpdateTxOutAmountRequestStruct *request)

{
  UpdateTxOutAmountRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  UpdateTxOutAmountRequestStruct *pUStack_18;
  anon_class_1_0_00000001 call_func;
  UpdateTxOutAmountRequestStruct *request_local;
  RawTransactionResponseStruct *result;
  
  local_1a = 0;
  pUStack_18 = request;
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  this = pUStack_18;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::UpdateTxOutAmount(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"UpdateTxOutAmount",&local_129);
  ExecuteStructApi<cfd::js::api::UpdateTxOutAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)(local_108 + 0x20),(api *)this,
             (UpdateTxOutAmountRequestStruct *)local_108,&local_128,in_R8);
  RawTransactionResponseStruct::operator=
            (__return_storage_ptr__,(RawTransactionResponseStruct *)(local_108 + 0x20));
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  ::~function((function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct ElementsTransactionStructApi::UpdateTxOutAmount(
    const UpdateTxOutAmountRequestStruct& request) {
  auto call_func = [](const UpdateTxOutAmountRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    ElementsAddressFactory address_factory;
    for (auto& txout : request.txouts) {
      uint32_t index = txout.index;
      if (!txout.direct_locking_script.empty()) {
        index = ctx.GetTxOutIndex(Script(txout.direct_locking_script));
      } else if (!txout.address.empty()) {
        if (ElementsConfidentialAddress::IsConfidentialAddress(
                txout.address)) {
          ElementsConfidentialAddress confidential_addr(txout.address);
          index = ctx.GetTxOutIndex(confidential_addr.GetUnblindedAddress());
        } else {
          index = ctx.GetTxOutIndex(address_factory.GetAddress(txout.address));
        }
      }
      ctx.SetTxOutValue(index, Amount(txout.amount));
    }

    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      UpdateTxOutAmountRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}